

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

void __thiscall
leveldb::log::LogTest_SkipIntoMultiRecord_Test::TestBody(LogTest_SkipIntoMultiRecord_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  size_type sVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertHelper local_78;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"foo","");
  BigString(&local_50,&local_70,0x18000);
  LogTest::Write(&this->super_LogTest,&local_50);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"correct","");
  LogTest::Write(&this->super_LogTest,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  LogTest::StartReadingAt(&this->super_LogTest,0x8000);
  LogTest::Read_abi_cxx11_(&local_50,&this->super_LogTest);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_70,"\"correct\"","Read()",(char (*) [8])"correct",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  cVar3 = (char)local_70._M_dataplus._M_p;
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0x1e8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
    }
  }
  sVar4 = local_70._M_string_length;
  if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_70._M_string_length !=
        (undefined8 *)(local_70._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_70._M_string_length);
    }
    operator_delete((void *)sVar4);
  }
  if (cVar3 != '\0') {
    pcVar2 = (this->super_LogTest).report_.message_._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,
               pcVar2 + (this->super_LogTest).report_.message_._M_string_length);
    pcVar5 = "";
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              ((internal *)&local_70,"\"\"","ReportMessage()",(char (*) [1])0x140b8e,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    cVar3 = (char)local_70._M_dataplus._M_p;
    if ((char)local_70._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_50);
      if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
        pcVar5 = *(char **)local_70._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
                 ,0x1e9,pcVar5);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
    }
    sVar4 = local_70._M_string_length;
    if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_70._M_string_length !=
          (undefined8 *)(local_70._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_70._M_string_length);
      }
      operator_delete((void *)sVar4);
    }
    if (cVar3 != '\0') {
      local_78.data_._0_4_ = 0;
      local_70._M_dataplus._M_p = (pointer)(this->super_LogTest).report_.dropped_bytes_;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&local_50,"0","DroppedBytes()",(int *)&local_78,
                 (unsigned_long *)&local_70);
      cVar3 = (char)local_50._M_dataplus._M_p;
      if ((char)local_50._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_70);
        if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_50._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
                   ,0x1ea,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
        }
      }
      if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_50._M_string_length !=
            (undefined8 *)(local_50._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_50._M_string_length);
        }
        operator_delete((void *)local_50._M_string_length);
      }
      if (cVar3 != '\0') {
        LogTest::Read_abi_cxx11_(&local_50,&this->super_LogTest);
        testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                  ((internal *)&local_70,"\"EOF\"","Read()",(char (*) [4])"EOF",&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((char)local_70._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_50);
          if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = *(char **)local_70._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
                     ,0x1eb,pcVar5);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
          }
        }
        if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_70._M_string_length !=
              (undefined8 *)(local_70._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_70._M_string_length);
          }
          operator_delete((void *)local_70._M_string_length);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(LogTest, SkipIntoMultiRecord) {
  // Consider a fragmented record:
  //    first(R1), middle(R1), last(R1), first(R2)
  // If initial_offset points to a record after first(R1) but before first(R2)
  // incomplete fragment errors are not actual errors, and must be suppressed
  // until a new first or full record is encountered.
  Write(BigString("foo", 3 * kBlockSize));
  Write("correct");
  StartReadingAt(kBlockSize);

  ASSERT_EQ("correct", Read());
  ASSERT_EQ("", ReportMessage());
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("EOF", Read());
}